

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int cargo_set_option_description(cargo_t ctx,char *optname,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list ap;
  int ret;
  char *fmt_local;
  char *optname_local;
  cargo_t ctx_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (ctx != (cargo_t)0x0) {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    local_48._4_4_ = 0x30;
    local_48._0_4_ = 0x18;
    iVar1 = cargo_set_option_descriptionv(ctx,optname,fmt,(__va_list_tag *)local_48);
    return iVar1;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x157e,"int cargo_set_option_description(cargo_t, const char *, const char *, ...)")
  ;
}

Assistant:

int cargo_set_option_description(cargo_t ctx,
                                 const char *optname,
                                 const char *fmt, ...)
{
    int ret = 0;
    va_list ap;
    assert(ctx);
    va_start(ap, fmt);
    ret = cargo_set_option_descriptionv(ctx, optname, fmt, ap);
    va_end(ap);
    return ret;
}